

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_open(SessionHandle **curl)

{
  int *piVar1;
  SessionHandle *data;
  char *pcVar2;
  CURLcode CVar3;
  
  data = (SessionHandle *)(*Curl_ccalloc)(1,0x8b98);
  if (data == (SessionHandle *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    data->magic = 0xc0dedbad;
    pcVar2 = (char *)(*Curl_cmalloc)(0x100);
    (data->state).headerbuff = pcVar2;
    if (pcVar2 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
      pcVar2 = (data->state).headerbuff;
      if (pcVar2 != (char *)0x0) {
        (*Curl_cfree)(pcVar2);
      }
      Curl_freeset(data);
      (*Curl_cfree)(data);
    }
    else {
      Curl_init_userdefined(&data->set);
      (data->state).headersize = 0x100;
      CVar3 = CURLE_OK;
      (data->state).lastconnect = (connectdata *)0x0;
      piVar1 = &(data->progress).flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
      (data->state).current_speed = -1;
      (data->wildcard).state = CURLWC_INIT;
      (data->wildcard).filelist = (curl_llist *)0x0;
      (data->set).fnmatch = (curl_fnmatch_callback)0x0;
      (data->set).maxconnects = 5;
      *curl = data;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_open(struct SessionHandle **curl)
{
  CURLcode res = CURLE_OK;
  struct SessionHandle *data;
  CURLcode status;

  /* Very simple start-up: alloc the struct, init it with zeroes and return */
  data = calloc(1, sizeof(struct SessionHandle));
  if(!data) {
    /* this is a very serious error */
    DEBUGF(fprintf(stderr, "Error: calloc of SessionHandle failed\n"));
    return CURLE_OUT_OF_MEMORY;
  }

  data->magic = CURLEASY_MAGIC_NUMBER;

  status = Curl_resolver_init(&data->state.resolver);
  if(status) {
    DEBUGF(fprintf(stderr, "Error: resolver_init failed\n"));
    free(data);
    return status;
  }

  /* We do some initial setup here, all those fields that can't be just 0 */

  data->state.headerbuff = malloc(HEADERSIZE);
  if(!data->state.headerbuff) {
    DEBUGF(fprintf(stderr, "Error: malloc of headerbuff failed\n"));
    res = CURLE_OUT_OF_MEMORY;
  }
  else {
    res = Curl_init_userdefined(&data->set);

    data->state.headersize=HEADERSIZE;

    Curl_convert_init(data);

    /* most recent connection is not yet defined */
    data->state.lastconnect = NULL;

    data->progress.flags |= PGRS_HIDE;
    data->state.current_speed = -1; /* init to negative == impossible */

    data->wildcard.state = CURLWC_INIT;
    data->wildcard.filelist = NULL;
    data->set.fnmatch = ZERO_NULL;
    data->set.maxconnects = DEFAULT_CONNCACHE_SIZE; /* for easy handles */
  }

  if(res) {
    Curl_resolver_cleanup(data->state.resolver);
    if(data->state.headerbuff)
      free(data->state.headerbuff);
    Curl_freeset(data);
    free(data);
    data = NULL;
  }
  else
    *curl = data;

  return res;
}